

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void * ma_aligned_malloc(size_t sz,size_t alignment,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  void *pvVar2;
  
  if ((alignment != 0) &&
     (pvVar1 = ma_malloc(sz + alignment + 7,pAllocationCallbacks), pvVar1 != (void *)0x0)) {
    pvVar2 = (void *)(-alignment & alignment + 7 + (long)pvVar1);
    *(void **)((long)pvVar2 + -8) = pvVar1;
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

MA_API void* ma_aligned_malloc(size_t sz, size_t alignment, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t extraBytes;
    void* pUnaligned;
    void* pAligned;

    if (alignment == 0) {
        return 0;
    }

    extraBytes = alignment-1 + sizeof(void*);

    pUnaligned = ma_malloc(sz + extraBytes, pAllocationCallbacks);
    if (pUnaligned == NULL) {
        return NULL;
    }

    pAligned = (void*)(((ma_uintptr)pUnaligned + extraBytes) & ~((ma_uintptr)(alignment-1)));
    ((void**)pAligned)[-1] = pUnaligned;

    return pAligned;
}